

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrappers.pb.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::UInt32Value::_InternalSerialize
          (UInt32Value *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  uint32_t uVar2;
  uint8_t *target_00;
  UnknownFieldSet *unknown_fields;
  uint32_t cached_has_bits;
  UInt32Value *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  UInt32Value *this_local;
  
  uVar2 = _internal_value(this);
  stream_local = (EpsCopyOutputStream *)target;
  if (uVar2 != 0) {
    target_00 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    uVar2 = _internal_value(this);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteUInt32ToArray(1,uVar2,target_00);
  }
  bVar1 = internal::InternalMetadata::have_unknown_fields
                    (&(this->super_Message).super_MessageLite._internal_metadata_);
  if (bVar1) {
    unknown_fields =
         internal::InternalMetadata::unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(this->super_Message).super_MessageLite._internal_metadata_,
                    UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,stream);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* UInt32Value::_InternalSerialize(
            ::uint8_t* target,
            ::google::protobuf::io::EpsCopyOutputStream* stream) const {
          const UInt32Value& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
          // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.UInt32Value)
          ::uint32_t cached_has_bits = 0;
          (void)cached_has_bits;

          // uint32 value = 1;
          if (this_._internal_value() != 0) {
            target = stream->EnsureSpace(target);
            target = ::_pbi::WireFormatLite::WriteUInt32ToArray(
                1, this_._internal_value(), target);
          }

          if (PROTOBUF_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
            target =
                ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
                    this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
          }
          // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.UInt32Value)
          return target;
        }